

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_scanline_p.h
# Opt level: O0

void __thiscall agg::scanline_p8::add_cell(scanline_p8 *this,int x,uint cover)

{
  uint cover_local;
  int x_local;
  scanline_p8 *this_local;
  
  *this->m_cover_ptr = (cover_type)cover;
  if ((x == this->m_last_x + 1) && (0 < this->m_cur_span->len)) {
    this->m_cur_span->len = this->m_cur_span->len + 1;
  }
  else {
    this->m_cur_span = this->m_cur_span + 1;
    this->m_cur_span->covers = this->m_cover_ptr;
    this->m_cur_span->x = (coord_type)x;
    this->m_cur_span->len = 1;
  }
  this->m_last_x = x;
  this->m_cover_ptr = this->m_cover_ptr + 1;
  return;
}

Assistant:

void add_cell(int x, unsigned cover)
        {
            *m_cover_ptr = (cover_type)cover;
            if(x == m_last_x+1 && m_cur_span->len > 0)
            {
                m_cur_span->len++;
            }
            else
            {
                m_cur_span++;
                m_cur_span->covers = m_cover_ptr;
                m_cur_span->x = (int16)x;
                m_cur_span->len = 1;
            }
            m_last_x = x;
            m_cover_ptr++;
        }